

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aabox.hpp
# Opt level: O2

bool __thiscall AABox::intersect(AABox *this,Ray *r)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  AABox *pAVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar8 = (r->dir).x;
  if (fVar8 <= 0.0) {
    fVar7 = (r->origin).x;
    fVar6 = this->x2 - fVar7;
    pAVar5 = this;
  }
  else {
    fVar7 = (r->origin).x;
    fVar6 = this->x1 - fVar7;
    pAVar5 = (AABox *)&this->x2;
  }
  fVar1 = pAVar5->x1;
  fVar2 = (r->dir).y;
  fVar3 = (r->origin).y;
  fVar4 = (r->origin).z;
  fVar6 = fmaxf(fVar6 / fVar8,((&this->y1)[fVar2 <= 0.0] - fVar3) / fVar2);
  fVar7 = fminf((fVar1 - fVar7) / fVar8,((&this->y1)[0.0 < fVar2] - fVar3) / fVar2);
  fVar8 = (r->dir).z;
  fVar6 = fmaxf(fVar6,((&this->z1)[fVar8 <= 0.0] - fVar4) / fVar8);
  fVar8 = fminf(fVar7,((&this->z1)[0.0 < fVar8] - fVar4) / fVar8);
  return (bool)(-(0.0 < fVar8) & -(fVar6 <= fVar8) & 1);
}

Assistant:

bool intersect(const Ray& r)
	{
		float tmin, tmax;
		if (r.dir.x > 0)
			tmin = (x1 - r.origin.x) / r.dir.x,
			tmax = (x2 - r.origin.x) / r.dir.x;
		else
			tmin = (x2 - r.origin.x) / r.dir.x,
			tmax = (x1 - r.origin.x) / r.dir.x;
		if (r.dir.y > 0)
			tmin = fmax(tmin, (y1 - r.origin.y) / r.dir.y),
			tmax = fmin(tmax, (y2 - r.origin.y) / r.dir.y);
		else
			tmin = fmax(tmin, (y2 - r.origin.y) / r.dir.y),
			tmax = fmin(tmax, (y1 - r.origin.y) / r.dir.y);
		if (r.dir.z > 0)
			tmin = fmax(tmin, (z1 - r.origin.z) / r.dir.z),
			tmax = fmin(tmax, (z2 - r.origin.z) / r.dir.z);
		else
			tmin = fmax(tmin, (z2 - r.origin.z) / r.dir.z),
			tmax = fmin(tmax, (z1 - r.origin.z) / r.dir.z);
		return tmin <= tmax && tmax > 0;
	}